

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
dit::anon_unknown_0::DepthStencilFormatCase::iterate(DepthStencilFormatCase *this)

{
  int iVar1;
  int iVar2;
  TextureFormat *pTVar3;
  reference data;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int local_a4c;
  undefined1 local_a48 [4];
  int ndx_1;
  int local_8c4;
  undefined1 local_8c0 [4];
  int ndx;
  MessageBuilder local_740;
  MessageBuilder local_5c0;
  MessageBuilder local_440;
  MessageBuilder local_2c0;
  undefined1 local_140 [8];
  PixelBufferAccess tmpStencilAccess;
  PixelBufferAccess tmpDepthAccess;
  ConstPixelBufferAccess inputStencilAccess;
  ConstPixelBufferAccess inputDepthAccess;
  PixelBufferAccess tmpAccess;
  allocator<unsigned_char> local_61;
  TextureFormat local_60;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpMem;
  undefined1 local_38 [8];
  ConstPixelBufferAccess inputAccess;
  DepthStencilFormatCase *this_local;
  
  tmpMem.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->super_TextureFormatCase).m_format;
  inputAccess.m_data = this;
  getInputAccess((ConstPixelBufferAccess *)local_38,
                 (TextureFormat)
                 tmpMem.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  pTVar3 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_38);
  local_60 = *pTVar3;
  iVar1 = tcu::getPixelSize(local_60);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_38);
  std::allocator<unsigned_char>::allocator(&local_61);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,(long)(iVar1 * iVar2)
             ,&local_61);
  std::allocator<unsigned_char>::~allocator(&local_61);
  pTVar3 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_38);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_38);
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&inputDepthAccess.m_data,pTVar3,iVar1,1,1,data);
  tcu::getEffectiveDepthStencilAccess
            ((ConstPixelBufferAccess *)&inputStencilAccess.m_data,(ConstPixelBufferAccess *)local_38
             ,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess
            ((ConstPixelBufferAccess *)&tmpDepthAccess.super_ConstPixelBufferAccess.m_data,
             (ConstPixelBufferAccess *)local_38,MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data,
             (PixelBufferAccess *)&inputDepthAccess.m_data,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)local_140,(PixelBufferAccess *)&inputDepthAccess.m_data,
             MODE_STENCIL);
  tcu::TestContext::setTestResult
            ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  TextureFormatCase::verifyInfoQueries(&this->super_TextureFormatCase);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,(ConstPixelBufferAccess *)&inputStencilAccess.m_data);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpDepthAccess.super_ConstPixelBufferAccess.m_data);
  TextureFormatCase::verifyGetPixDepth
            (&this->super_TextureFormatCase,(ConstPixelBufferAccess *)&inputStencilAccess.m_data,
             (ConstPixelBufferAccess *)local_38);
  TextureFormatCase::verifyGetPixStencil
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpDepthAccess.super_ConstPixelBufferAccess.m_data,
             (ConstPixelBufferAccess *)local_38);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_2c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_2c0,
                      (char (*) [61])"Copying both depth and stencil with getPixel() -> setPixel()")
  ;
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2c0);
  copyPixels((ConstPixelBufferAccess *)&inputStencilAccess.m_data,
             (PixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  copyPixels((ConstPixelBufferAccess *)&tmpDepthAccess.super_ConstPixelBufferAccess.m_data,
             (PixelBufferAccess *)local_140);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,(ConstPixelBufferAccess *)local_140);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_440,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_440,
                      (char (*) [87])
                      "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_440);
  copyGetSetDepth((ConstPixelBufferAccess *)&inputStencilAccess.m_data,
                  (PixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  copyGetSetStencil((ConstPixelBufferAccess *)&tmpDepthAccess.super_ConstPixelBufferAccess.m_data,
                    (PixelBufferAccess *)local_140);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,(ConstPixelBufferAccess *)local_140);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_5c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_5c0,
                      (char (*) [81])
                      "Verifying that clearing depth component with clearDepth() doesn\'t affect stencil"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  tcu::copy((EVP_PKEY_CTX *)&inputDepthAccess.m_data,(EVP_PKEY_CTX *)local_38);
  tcu::clearDepth((PixelBufferAccess *)&inputDepthAccess.m_data,0.0);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,(ConstPixelBufferAccess *)local_140);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_740,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_740,
                      (char (*) [83])
                      "Verifying that clearing stencil component with clearStencil() doesn\'t affect depth"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_740);
  tcu::copy((EVP_PKEY_CTX *)&inputDepthAccess.m_data,(EVP_PKEY_CTX *)local_38);
  tcu::clearStencil((PixelBufferAccess *)&inputDepthAccess.m_data,0);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_8c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_8c0,
                      (char (*) [82])
                      "Verifying that clearing depth component with setPixDepth() doesn\'t affect stencil"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_8c0);
  tcu::copy((EVP_PKEY_CTX *)&inputDepthAccess.m_data,(EVP_PKEY_CTX *)local_38);
  local_8c4 = 0;
  while( true ) {
    iVar1 = local_8c4;
    iVar2 = tcu::ConstPixelBufferAccess::getWidth
                      ((ConstPixelBufferAccess *)&inputDepthAccess.m_data);
    if (iVar2 <= iVar1) break;
    tcu::PixelBufferAccess::setPixDepth
              ((PixelBufferAccess *)&inputDepthAccess.m_data,0.0,local_8c4,0,0);
    local_8c4 = local_8c4 + 1;
  }
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,(ConstPixelBufferAccess *)local_140);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_a48,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_a48,
                      (char (*) [84])
                      "Verifying that clearing stencil component with setPixStencil() doesn\'t affect depth"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_a48);
  tcu::copy((EVP_PKEY_CTX *)&inputDepthAccess.m_data,(EVP_PKEY_CTX *)local_38);
  local_a4c = 0;
  while( true ) {
    iVar1 = tcu::ConstPixelBufferAccess::getWidth
                      ((ConstPixelBufferAccess *)&inputDepthAccess.m_data);
    if (iVar1 <= local_a4c) break;
    tcu::PixelBufferAccess::setPixStencil
              ((PixelBufferAccess *)&inputDepthAccess.m_data,0,local_a4c,0,0);
    local_a4c = local_a4c + 1;
  }
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,
             (ConstPixelBufferAccess *)&tmpStencilAccess.super_ConstPixelBufferAccess.m_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const ConstPixelBufferAccess	inputAccess			= getInputAccess(m_format);
		vector<deUint8>					tmpMem				(getPixelSize(inputAccess.getFormat())*inputAccess.getWidth());
		const PixelBufferAccess			tmpAccess			(inputAccess.getFormat(), inputAccess.getWidth(), 1, 1, &tmpMem[0]);
		const ConstPixelBufferAccess	inputDepthAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	inputStencilAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_STENCIL);
		const PixelBufferAccess			tmpDepthAccess		= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_DEPTH);
		const PixelBufferAccess			tmpStencilAccess	= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_STENCIL);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		verifyInfoQueries();

		verifyRead(inputDepthAccess);
		verifyRead(inputStencilAccess);

		verifyGetPixDepth(inputDepthAccess, inputAccess);
		verifyGetPixStencil(inputStencilAccess, inputAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPixel() -> setPixel()" << TestLog::EndMessage;
		copyPixels(inputDepthAccess, tmpDepthAccess);
		copyPixels(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()" << TestLog::EndMessage;
		copyGetSetDepth(inputDepthAccess, tmpDepthAccess);
		copyGetSetStencil(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with clearDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearDepth(tmpAccess, 0.0f);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with clearStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearStencil(tmpAccess, 0);
		verifyRead(tmpDepthAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with setPixDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixDepth(0.0f, ndx, 0, 0);

		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with setPixStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixStencil(0, ndx, 0, 0);

		verifyRead(tmpDepthAccess);

		return STOP;
	}